

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.hpp
# Opt level: O2

streamsize __thiscall
stream::checksum_filter::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (checksum_filter *this,linked_streambuf<char,_std::char_traits<char>_> *src,char *dest,
          streamsize n)

{
  checksum *pcVar1;
  size_t size;
  anon_union_32_6_50477601_for_checksum_0 local_3c;
  checksum_type local_1c;
  
  size = boost::iostreams::detail::read_device_impl<boost::iostreams::streambuf_tag>::
         read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>(src,dest,n);
  if ((long)size < 1) {
    if (this->output != (checksum *)0x0) {
      crypto::hasher::finalize((checksum *)&local_3c,&this->hasher);
      pcVar1 = this->output;
      pcVar1->type = local_1c;
      *(undefined8 *)((long)&pcVar1->field_0 + 0x10) = local_3c._16_8_;
      *(undefined8 *)((long)&pcVar1->field_0 + 0x18) = local_3c._24_8_;
      *(undefined8 *)&pcVar1->field_0 = local_3c._0_8_;
      *(undefined8 *)((long)&pcVar1->field_0 + 8) = local_3c._8_8_;
      this->output = (checksum *)0x0;
    }
  }
  else {
    crypto::hasher::update(&this->hasher,dest,size);
  }
  return size;
}

Assistant:

std::streamsize read(Source & src, char * dest, std::streamsize n) {
		
		std::streamsize nread = boost::iostreams::read(src, dest, n);
		
		if(nread > 0) {
			hasher.update(dest, size_t(nread));
		} else if(output) {
			*output = hasher.finalize();
			output = NULL;
		}
		
		return nread;
	}